

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddIte.c
# Opt level: O0

DdNode * cuddAddIteRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  DdNode *one_00;
  DdNode *zero_00;
  DdManager *T;
  DdManager *E;
  DdManager *local_b8;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  DdHalfWord local_9c;
  uint local_98;
  int index;
  uint v;
  uint toph;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *Hnv;
  DdNode *Hv;
  DdNode *Gnv;
  DdNode *Gv;
  DdNode *Fnv;
  DdNode *Fv;
  DdNode *r;
  DdNode *zero;
  DdNode *one;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_9c = 0xffffffff;
  one_00 = dd->one;
  dd_local = (DdManager *)g;
  if ((f != one_00) && (zero_00 = dd->zero, dd_local = (DdManager *)h, f != zero_00)) {
    one = h;
    h_local = g;
    g_local = f;
    f_local = &dd->sentinel;
    addVarToConst(f,&h_local,&one,one_00,zero_00);
    if (h_local == one) {
      dd_local = (DdManager *)h_local;
    }
    else if ((h_local == one_00) && (one == zero_00)) {
      dd_local = (DdManager *)g_local;
    }
    else {
      if (g_local->index == 0x7fffffff) {
        local_a0 = g_local->index;
      }
      else {
        local_a0 = *(uint *)(f_local[7].Id + (ulong)g_local->index * 4);
      }
      if (h_local->index == 0x7fffffff) {
        local_a4 = h_local->index;
      }
      else {
        local_a4 = *(uint *)(f_local[7].Id + (ulong)h_local->index * 4);
      }
      if (one->index == 0x7fffffff) {
        local_a8 = one->index;
      }
      else {
        local_a8 = *(uint *)(f_local[7].Id + (ulong)one->index * 4);
      }
      if (local_a8 < local_a4) {
        local_ac = local_a8;
      }
      else {
        local_ac = local_a4;
      }
      local_98 = local_ac;
      if (((local_a0 < local_ac) && ((g_local->type).kids.T == one_00)) &&
         ((g_local->type).kids.E == zero_00)) {
        dd_local = (DdManager *)cuddUniqueInter((DdManager *)f_local,g_local->index,h_local,one);
      }
      else if (((local_a0 < local_ac) && ((g_local->type).kids.T == zero_00)) &&
              ((g_local->type).kids.E == one_00)) {
        dd_local = (DdManager *)cuddUniqueInter((DdManager *)f_local,g_local->index,one,h_local);
      }
      else {
        dd_local = (DdManager *)cuddCacheLookup((DdManager *)f_local,2,g_local,h_local,one);
        if (dd_local == (DdManager *)0x0) {
          if (local_ac < local_a0) {
            Gv = g_local;
            Fnv = g_local;
          }
          else {
            if (local_ac < local_a0) {
              local_b0 = local_ac;
            }
            else {
              local_b0 = local_a0;
            }
            local_98 = local_b0;
            local_9c = g_local->index;
            Fnv = (g_local->type).kids.T;
            Gv = (g_local->type).kids.E;
          }
          if (local_a4 == local_98) {
            local_9c = h_local->index;
            Gnv = (h_local->type).kids.T;
            Hv = (h_local->type).kids.E;
          }
          else {
            Hv = h_local;
            Gnv = h_local;
          }
          if (local_a8 == local_98) {
            local_9c = one->index;
            Hnv = (one->type).kids.T;
            t = (one->type).kids.E;
          }
          else {
            t = one;
            Hnv = one;
          }
          T = (DdManager *)cuddAddIteRecur((DdManager *)f_local,Fnv,Gnv,Hnv);
          if (T == (DdManager *)0x0) {
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
            E = (DdManager *)cuddAddIteRecur((DdManager *)f_local,Gv,Hv,t);
            if (E == (DdManager *)0x0) {
              Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)T);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
              local_b8 = T;
              if (T != E) {
                local_b8 = (DdManager *)
                           cuddUniqueInter((DdManager *)f_local,local_9c,(DdNode *)T,(DdNode *)E);
              }
              if (local_b8 == (DdManager *)0x0) {
                Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)T);
                Cudd_RecursiveDeref((DdManager *)f_local,(DdNode *)E);
                dd_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
                *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
                cuddCacheInsert((DdManager *)f_local,2,g_local,h_local,one,&local_b8->sentinel);
                dd_local = local_b8;
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddAddIteRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode *one,*zero;
    DdNode *r,*Fv,*Fnv,*Gv,*Gnv,*Hv,*Hnv,*t,*e;
    unsigned int topf,topg,toph,v;
    int index = -1;

    statLine(dd);
    /* Trivial cases. */

    /* One variable cases. */
    if (f == (one = DD_ONE(dd))) {      /* ITE(1,G,H) = G */
        return(g);
    }
    if (f == (zero = DD_ZERO(dd))) {    /* ITE(0,G,H) = H */
        return(h);
    }

    /* From now on, f is known to not be a constant. */
    addVarToConst(f,&g,&h,one,zero);

    /* Check remaining one variable cases. */
    if (g == h) {                       /* ITE(F,G,G) = G */
        return(g);
    }

    if (g == one) {                     /* ITE(F,1,0) = F */
        if (h == zero) return(f);
    }

    topf = cuddI(dd,f->index);
    topg = cuddI(dd,g->index);
    toph = cuddI(dd,h->index);
    v = ddMin(topg,toph);

    /* A shortcut: ITE(F,G,H) = (x,G,H) if F=(x,1,0), x < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        r = cuddUniqueInter(dd,(int)f->index,g,h);
        return(r);
    }
    if (topf < v && cuddT(f) == zero && cuddE(f) == one) {
        r = cuddUniqueInter(dd,(int)f->index,h,g);
        return(r);
    }

    /* Check cache. */
    r = cuddCacheLookup(dd,DD_ADD_ITE_TAG,f,g,h);
    if (r != NULL) {
        return(r);
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf,v);      /* v = top_var(F,G,H) */
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        index = g->index;
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        index = h->index;
        Hv = cuddT(h); Hnv = cuddE(h);
    } else {
        Hv = Hnv = h;
    }
    
    /* Recursive step. */
    t = cuddAddIteRecur(dd,Fv,Gv,Hv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddAddIteRecur(dd,Fnv,Gnv,Hnv);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd,t);
        return(NULL);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
    if (r == NULL) {
        Cudd_RecursiveDeref(dd,t);
        Cudd_RecursiveDeref(dd,e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert(dd,DD_ADD_ITE_TAG,f,g,h,r);

    return(r);

}